

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O3

bool btGjkEpaSolver2::Distance
               (btConvexShape *shape0,btTransform *wtrs0,btConvexShape *shape1,btTransform *wtrs1,
               btVector3 *guess,sResults *results)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _ _Var5;
  code *pcVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 uVar9;
  float in_XMM1_Da;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  btVector3 bVar17;
  tShape shape;
  GJK gjk;
  btVector3 local_2a0;
  tShape local_290;
  GJK local_200;
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_290,false);
  local_200.m_nfree = 0;
  local_200.m_current = 0;
  local_200.m_ray.m_floats[0] = 0.0;
  local_200.m_ray.m_floats[1] = 0.0;
  local_200.m_ray.m_floats[2] = 0.0;
  local_200.m_ray.m_floats[3] = 0.0;
  local_200.m_status = Failed;
  local_200.m_distance = 0.0;
  _Var5 = gjkepa2_impl::GJK::Evaluate(&local_200,&local_290,guess);
  if (_Var5 == Valid) {
    fVar15 = 0.0;
    fVar16 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    if ((local_200.m_simplex)->rank != 0) {
      uVar8 = 0;
      do {
        plVar7 = (long *)((long)&(local_290.m_shapes[0]->super_btCollisionShape).
                                 _vptr_btCollisionShape + local_290._136_8_);
        pcVar6 = (code *)local_290.Ls;
        if ((local_290.Ls & 1) != 0) {
          pcVar6 = *(code **)(local_290.Ls + *plVar7 + -1);
        }
        fVar1 = (local_200.m_simplex)->p[uVar8];
        uVar9 = (*pcVar6)(plVar7,(local_200.m_simplex)->c[uVar8]);
        uVar2 = *(ulong *)((local_200.m_simplex)->c[uVar8]->d).m_floats ^ 0x8000000080000000;
        local_2a0.m_floats[2] = -((local_200.m_simplex)->c[uVar8]->d).m_floats[2];
        local_2a0.m_floats[0] = (btScalar)(int)uVar2;
        local_2a0.m_floats[1] = (btScalar)(int)(uVar2 >> 0x20);
        local_2a0.m_floats[3] = 0.0;
        bVar17 = gjkepa2_impl::MinkowskiDiff::Support(&local_290,&local_2a0,1);
        fVar11 = fVar11 + (float)uVar9 * fVar1;
        fVar12 = fVar12 + (float)((ulong)uVar9 >> 0x20) * fVar1;
        fVar15 = fVar15 + bVar17.m_floats[0] * fVar1;
        fVar16 = fVar16 + bVar17.m_floats[1] * fVar1;
        fVar13 = fVar13 + in_XMM1_Da * fVar1;
        fVar14 = fVar14 + bVar17.m_floats[2] * fVar1;
        uVar8 = uVar8 + 1;
        in_XMM1_Da = bVar17.m_floats[2];
      } while (uVar8 < (local_200.m_simplex)->rank);
    }
    uVar9 = *(undefined8 *)(wtrs0->m_origin).m_floats;
    auVar4._4_4_ = (float)((ulong)uVar9 >> 0x20) +
                   (wtrs0->m_basis).m_el[1].m_floats[2] * fVar13 +
                   (wtrs0->m_basis).m_el[1].m_floats[0] * fVar11 +
                   (wtrs0->m_basis).m_el[1].m_floats[1] * fVar12;
    auVar4._0_4_ = (float)uVar9 +
                   (wtrs0->m_basis).m_el[0].m_floats[2] * fVar13 +
                   (wtrs0->m_basis).m_el[0].m_floats[0] * fVar11 +
                   (wtrs0->m_basis).m_el[0].m_floats[1] * fVar12;
    auVar4._8_4_ = (wtrs0->m_basis).m_el[2].m_floats[2] * fVar13 +
                   (wtrs0->m_basis).m_el[2].m_floats[0] * fVar11 +
                   (wtrs0->m_basis).m_el[2].m_floats[1] * fVar12 + (wtrs0->m_origin).m_floats[2];
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar4;
    uVar9 = *(undefined8 *)(wtrs0->m_origin).m_floats;
    auVar10._0_4_ =
         (float)uVar9 +
         (wtrs0->m_basis).m_el[0].m_floats[2] * fVar14 +
         (wtrs0->m_basis).m_el[0].m_floats[0] * fVar15 +
         (wtrs0->m_basis).m_el[0].m_floats[1] * fVar16;
    auVar10._4_4_ =
         (float)((ulong)uVar9 >> 0x20) +
         (wtrs0->m_basis).m_el[1].m_floats[2] * fVar14 +
         (wtrs0->m_basis).m_el[1].m_floats[0] * fVar15 +
         (wtrs0->m_basis).m_el[1].m_floats[1] * fVar16;
    auVar10._8_4_ =
         (wtrs0->m_basis).m_el[2].m_floats[2] * fVar14 +
         (wtrs0->m_basis).m_el[2].m_floats[0] * fVar15 +
         (wtrs0->m_basis).m_el[2].m_floats[1] * fVar16 + (wtrs0->m_origin).m_floats[2];
    auVar10._12_4_ = 0;
    *(undefined1 (*) [16])results->witnesses[1].m_floats = auVar10;
    fVar11 = fVar11 - fVar15;
    fVar12 = fVar12 - fVar16;
    fVar13 = fVar13 - fVar14;
    fVar14 = SQRT(fVar13 * fVar13 + fVar11 * fVar11 + fVar12 * fVar12);
    results->distance = fVar14;
    fVar14 = (float)(~-(uint)(0.0001 < fVar14) & 0x3f800000 |
                    (uint)(1.0 / fVar14) & -(uint)(0.0001 < fVar14));
    auVar3._4_4_ = fVar14 * fVar12;
    auVar3._0_4_ = fVar14 * fVar11;
    auVar3._8_4_ = fVar13;
    auVar3._12_4_ = 0;
    *(undefined1 (*) [16])(results->normal).m_floats = auVar3;
    (results->normal).m_floats[2] = fVar14 * fVar13;
  }
  else {
    results->status = (_Var5 != Inside) + Penetrating;
  }
  return _Var5 == Valid;
}

Assistant:

bool		btGjkEpaSolver2::Distance(	const btConvexShape*	shape0,
									  const btTransform&		wtrs0,
									  const btConvexShape*	shape1,
									  const btTransform&		wtrs1,
									  const btVector3&		guess,
									  sResults&				results)
{
	tShape			shape;
	Initialize(shape0,wtrs0,shape1,wtrs1,results,shape,false);
	GJK				gjk;
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,guess);
	if(gjk_status==GJK::eStatus::Valid)
	{
		btVector3	w0=btVector3(0,0,0);
		btVector3	w1=btVector3(0,0,0);
		for(U i=0;i<gjk.m_simplex->rank;++i)
		{
			const btScalar	p=gjk.m_simplex->p[i];
			w0+=shape.Support( gjk.m_simplex->c[i]->d,0)*p;
			w1+=shape.Support(-gjk.m_simplex->c[i]->d,1)*p;
		}
		results.witnesses[0]	=	wtrs0*w0;
		results.witnesses[1]	=	wtrs0*w1;
		results.normal			=	w0-w1;
		results.distance		=	results.normal.length();
		results.normal			/=	results.distance>GJK_MIN_DISTANCE?results.distance:1;
		return(true);
	}
	else
	{
		results.status	=	gjk_status==GJK::eStatus::Inside?
			sResults::Penetrating	:
		sResults::GJK_Failed	;
		return(false);
	}
}